

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

void __thiscall cmCTestScriptHandler::~cmCTestScriptHandler(cmCTestScriptHandler *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  pointer pcVar2;
  
  (this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCTestScriptHandler_006b5cc8;
  this->Makefile = (cmMakefile *)0x0;
  if (this->LocalGenerator != (cmLocalGenerator *)0x0) {
    (*this->LocalGenerator->_vptr_cmLocalGenerator[1])();
  }
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
  }
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  this_00 = this->CMake;
  if (this_00 != (cmake *)0x0) {
    cmake::~cmake(this_00);
    operator_delete(this_00,0x260);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ExtraUpdates);
  pcVar2 = (this->CMOutFile)._M_dataplus._M_p;
  paVar1 = &(this->CMOutFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->CMakeCmd)._M_dataplus._M_p;
  paVar1 = &(this->CMakeCmd).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->InitialCache)._M_dataplus._M_p;
  paVar1 = &(this->InitialCache).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->CTestEnv)._M_dataplus._M_p;
  paVar1 = &(this->CTestEnv).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->UpdateCmd)._M_dataplus._M_p;
  paVar1 = &(this->UpdateCmd).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->CTestCmd)._M_dataplus._M_p;
  paVar1 = &(this->CTestCmd).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->CVSCheckOut)._M_dataplus._M_p;
  paVar1 = &(this->CVSCheckOut).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->CTestRoot)._M_dataplus._M_p;
  paVar1 = &(this->CTestRoot).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->BackupBinaryDir)._M_dataplus._M_p;
  paVar1 = &(this->BackupBinaryDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->BackupSourceDir)._M_dataplus._M_p;
  paVar1 = &(this->BackupSourceDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->BinaryDir)._M_dataplus._M_p;
  paVar1 = &(this->BinaryDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->SourceDir)._M_dataplus._M_p;
  paVar1 = &(this->SourceDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->ScriptProcessScope).super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ConfigurationScripts);
  cmCTestGenericHandler::~cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  return;
}

Assistant:

cmCTestScriptHandler::~cmCTestScriptHandler()
{
  // local generator owns the makefile
  this->Makefile = 0;
  if (this->LocalGenerator)
    {
    delete this->LocalGenerator;
    }
  this->LocalGenerator = 0;
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    }
  this->GlobalGenerator = 0;
  if (this->CMake)
    {
    delete this->CMake;
    }
}